

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

bool __thiscall cmSourceFile::FindFullPath(cmSourceFile *this,string *error,string *cmp0115Warning)

{
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  PolicyStatus PVar3;
  PolicyStatus PVar4;
  cmake *this_01;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  bool bVar6;
  basic_string_view<char,_std::char_traits<char>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  string err;
  string local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  exts;
  anon_class_56_7_c6d6a0c4 findInDir;
  string local_50;
  
  bVar1 = GetIsGenerated(this,GlobalAndLocal);
  if (bVar1) {
    cmSourceFileLocation::DirectoryUseBinary(&this->Location);
    cmSourceFileLocation::GetFullPath_abi_cxx11_((string *)&findInDir,&this->Location);
    std::__cxx11::string::operator=((string *)&this->FullPath,(string *)&findInDir);
    std::__cxx11::string::~string((string *)&findInDir);
    this->FindFullPathFailed = false;
    return true;
  }
  if (this->FindFullPathFailed != false) {
    return false;
  }
  this_00 = (this->Location).Makefile;
  cmSourceFileLocation::GetFullPath_abi_cxx11_(&local_c0,&this->Location);
  this_01 = cmMakefile::GetCMakeInstance(this_00);
  cmake::GetAllExtensions_abi_cxx11_(&exts,this_01);
  PVar2 = cmMakefile::GetPolicyStatus(this_00,CMP0115,false);
  PVar3 = cmMakefile::GetPolicyStatus(this_00,CMP0163,false);
  PVar4 = cmMakefile::GetPolicyStatus(this_00,CMP0118,false);
  findInDir.cmp0118new = WARN < (PVar4 | PVar3);
  findInDir.lPath = &local_c0;
  findInDir.this = this;
  findInDir.exts = &exts;
  findInDir.cmp0115 = PVar2;
  findInDir.cmp0115Warning = cmp0115Warning;
  findInDir.makefile = this_00;
  if ((this->Location).AmbiguousDirectory == true) {
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00);
    bVar1 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()(&findInDir,psVar5);
    bVar6 = true;
    if (bVar1) goto LAB_0043fdcc;
    psVar5 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
    bVar1 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()(&findInDir,psVar5);
  }
  else {
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    err.field_2._M_local_buf[0] = '\0';
    bVar1 = FindFullPath::anon_class_56_7_c6d6a0c4::operator()(&findInDir,&err);
    std::__cxx11::string::~string((string *)&err);
  }
  bVar6 = true;
  if (!bVar1) {
    cmStrCat<char_const(&)[28],std::__cxx11::string_const&>
              (&err,(char (*) [28])"Cannot find source file:\n  ",&local_c0);
    if (PVar2 < NEW) {
      cmStrCat<std::__cxx11::string&,char_const(&)[18]>(&local_50,&err,(char (*) [18])0x684b56);
      std::__cxx11::string::operator=((string *)&err,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      for (; exts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             exts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
          exts.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               exts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        cmStrCat<std::__cxx11::string&,char_const(&)[3],std::__cxx11::string_const&>
                  (&local_50,&err,(char (*) [3])0x6b06b4,
                   exts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::operator=((string *)&err,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    __y._M_str = "FILE_SET";
    __y._M_len = 8;
    __x._M_str = local_c0._M_dataplus._M_p;
    __x._M_len = local_c0._M_string_length;
    bVar1 = std::operator==(__x,__y);
    if (bVar1) {
      std::__cxx11::string::append((char *)&err);
    }
    if (error == (string *)0x0) {
      cmMakefile::IssueMessage(this_00,FATAL_ERROR,&err);
    }
    else {
      std::__cxx11::string::operator=((string *)error,(string *)&err);
    }
    this->FindFullPathFailed = true;
    std::__cxx11::string::~string((string *)&err);
    bVar6 = false;
  }
LAB_0043fdcc:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&exts);
  std::__cxx11::string::~string((string *)&local_c0);
  return bVar6;
}

Assistant:

bool cmSourceFile::FindFullPath(std::string* error,
                                std::string* cmp0115Warning)
{
  // If the file is generated compute the location without checking on disk.
  // Note: We also check for a locally set GENERATED property, because
  //       it might have been set before policy CMP0118 (or CMP0163) was set
  //       to NEW.
  if (this->GetIsGenerated(CheckScope::GlobalAndLocal)) {
    // The file is either already a full path or is relative to the
    // build directory for the target.
    this->Location.DirectoryUseBinary();
    this->FullPath = this->Location.GetFullPath();
    this->FindFullPathFailed = false;
    return true;
  }

  // If this method has already failed once do not try again.
  if (this->FindFullPathFailed) {
    return false;
  }

  // The file is not generated.  It must exist on disk.
  cmMakefile const* makefile = this->Location.GetMakefile();
  // Location path
  std::string const& lPath = this->Location.GetFullPath();
  // List of extension lists
  std::vector<std::string> exts =
    makefile->GetCMakeInstance()->GetAllExtensions();
  auto cmp0115 = makefile->GetPolicyStatus(cmPolicies::CMP0115);
  auto cmp0163 = makefile->GetPolicyStatus(cmPolicies::CMP0163);
  auto cmp0118 = makefile->GetPolicyStatus(cmPolicies::CMP0118);
  bool const cmp0163new =
    cmp0163 != cmPolicies::OLD && cmp0163 != cmPolicies::WARN;
  bool const cmp0118new =
    cmp0163new || (cmp0118 != cmPolicies::OLD && cmp0118 != cmPolicies::WARN);

  // Tries to find the file in a given directory
  auto findInDir = [this, &exts, &lPath, cmp0115, cmp0115Warning, cmp0118new,
                    makefile](std::string const& dir) -> bool {
    // Compute full path
    std::string const fullPath = cmSystemTools::CollapseFullPath(lPath, dir);
    // Try full path
    // Is this file globally marked as generated? Then mark so locally.
    if (cmp0118new &&
        makefile->GetGlobalGenerator()->IsGeneratedFile(fullPath)) {
      this->IsGenerated = true;
    }
    if (this->IsGenerated || cmSystemTools::FileExists(fullPath)) {
      this->FullPath = fullPath;
      return true;
    }
    // This has to be an if statement due to a bug in Oracle Developer Studio.
    // See https://community.oracle.com/tech/developers/discussion/4476246/
    // for details.
    if (cmp0115 == cmPolicies::OLD || cmp0115 == cmPolicies::WARN) {
      // Try full path with extension
      for (std::string const& ext : exts) {
        if (!ext.empty()) {
          std::string extPath = cmStrCat(fullPath, '.', ext);
          // Is this file globally marked as generated? Then mark so locally.
          if (cmp0118new &&
              makefile->GetGlobalGenerator()->IsGeneratedFile(extPath)) {
            this->IsGenerated = true;
          }
          if (this->IsGenerated || cmSystemTools::FileExists(extPath)) {
            this->FullPath = extPath;
            if (cmp0115 == cmPolicies::WARN) {
              std::string warning =
                cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0115),
                         "\nFile:\n  ", extPath);
              if (cmp0115Warning) {
                *cmp0115Warning = std::move(warning);
              } else {
                makefile->GetCMakeInstance()->IssueMessage(
                  MessageType::AUTHOR_WARNING, warning);
              }
            }
            return true;
          }
        }
      }
    }
    // File not found
    return false;
  };

  // Try to find the file in various directories
  if (this->Location.DirectoryIsAmbiguous()) {
    if (findInDir(makefile->GetCurrentSourceDirectory()) ||
        findInDir(makefile->GetCurrentBinaryDirectory())) {
      return true;
    }
  } else {
    if (findInDir({})) {
      return true;
    }
  }

  // Compose error
  std::string err = cmStrCat("Cannot find source file:\n  ", lPath);
  switch (cmp0115) {
    case cmPolicies::OLD:
    case cmPolicies::WARN:
      err = cmStrCat(err, "\nTried extensions");
      for (auto const& ext : exts) {
        err = cmStrCat(err, " .", ext);
      }
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
    case cmPolicies::NEW:
      break;
  }
  if (lPath == "FILE_SET"_s) {
    err += "\nHint: the FILE_SET keyword may only appear after a visibility "
           "specifier or another FILE_SET within the target_sources() "
           "command.";
  }
  if (error != nullptr) {
    *error = std::move(err);
  } else {
    makefile->IssueMessage(MessageType::FATAL_ERROR, err);
  }
  this->FindFullPathFailed = true;

  // File not found
  return false;
}